

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decoder_alloc_tile_data(AV1Decoder *pbi,int n_tiles)

{
  void *pvVar1;
  int in_ESI;
  size_t in_RDI;
  TileDataDec *tile_data;
  int i;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  size_t align;
  
  align = in_RDI;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(undefined4 *)(align + 0x48d28) = 0;
  pvVar1 = aom_memalign(align,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(void **)(align + 0x48d20) = pvVar1;
  if (*(long *)(align + 0x48d20) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate pbi->tile_data");
  }
  *(int *)(align + 0x48d28) = in_ESI;
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    memset((void *)(*(long *)(align + 0x48d20) + (long)iVar2 * 0x53a0 + 0x5360),0,0x40);
  }
  *(undefined4 *)(align + 0x5f6dc) = 0;
  return;
}

Assistant:

static inline void decoder_alloc_tile_data(AV1Decoder *pbi, const int n_tiles) {
  AV1_COMMON *const cm = &pbi->common;
  aom_free(pbi->tile_data);
  pbi->allocated_tiles = 0;
  CHECK_MEM_ERROR(cm, pbi->tile_data,
                  aom_memalign(32, n_tiles * sizeof(*pbi->tile_data)));
  pbi->allocated_tiles = n_tiles;
  for (int i = 0; i < n_tiles; i++) {
    TileDataDec *const tile_data = pbi->tile_data + i;
    av1_zero(tile_data->dec_row_mt_sync);
  }
  pbi->allocated_row_mt_sync_rows = 0;
}